

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>::
fastAccessDx(FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>
             *this,int i)

{
  Fad<double> *in_RSI;
  Fad<double> *in_RDI;
  Fad<double> *this_00;
  Fad<double> *in_stack_ffffffffffffff50;
  Fad<double> *in_stack_ffffffffffffff58;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  *in_stack_ffffffffffffff68;
  Fad<double> *in_stack_ffffffffffffff70;
  FadExpr<FadUnaryMin<Fad<double>_>_> *in_stack_ffffffffffffff78;
  
  this_00 = in_RDI;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::fastAccessDx
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)in_RSI,
             (int)((ulong)in_RDI >> 0x20));
  Fad<double>::operator-(in_RSI);
  FadCst<double>::val((FadCst<double> *)in_RSI);
  operator*<FadExpr<FadUnaryMin<Fad<double>_>_>,_double,_nullptr>
            (in_stack_ffffffffffffff78,(double)in_stack_ffffffffffffff70);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::val
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)in_RDI);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::val
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)in_RDI);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  operator/<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_> *)
             in_stack_ffffffffffffff58,
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff50);
  Fad<double>::
  Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>>>,FadCst<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)this_00);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)this_00);
  Fad<double>::~Fad(this_00);
  Fad<double>::~Fad(this_00);
  FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_> *)this_00
            );
  FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x1ebbdf1);
  Fad<double>::~Fad(this_00);
  return this_00;
}

Assistant:

value_type fastAccessDx(int i) const { return (- right_.fastAccessDx(i) * left_.val() ) 
					   / (right_.val() * right_.val()) ;}